

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__texture1D_enable
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *buffer;
  bool bVar1;
  undefined8 in_RAX;
  byte *pbVar2;
  StringHash SVar3;
  uint64 uVar4;
  int iVar5;
  bool bVar6;
  xmlChar **ppxVar7;
  bool failed_1;
  bool failed;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pbVar2 = (byte *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                               ).super_ParserTemplateBase.mStackMemoryManager,0x18);
  pbVar2[0] = 0;
  pbVar2[1] = 0;
  pbVar2[2] = 0;
  pbVar2[3] = 0;
  pbVar2[4] = 0;
  pbVar2[5] = 0;
  pbVar2[6] = 0;
  pbVar2[7] = 0;
  pbVar2[8] = 0;
  pbVar2[9] = 0;
  pbVar2[10] = 0;
  pbVar2[0xb] = 0;
  pbVar2[0xc] = 0;
  pbVar2[0xd] = 0;
  pbVar2[0xe] = 0;
  pbVar2[0xf] = 0;
  pbVar2[0x10] = 0;
  pbVar2[0x11] = 0;
  pbVar2[0x12] = 0;
  pbVar2[0x13] = 0;
  pbVar2[0x14] = 0;
  pbVar2[0x15] = 0;
  pbVar2[0x16] = 0;
  pbVar2[0x17] = 0;
  *attributeDataPtr = pbVar2;
  ppxVar7 = attributes->attributes;
  bVar6 = true;
  if (ppxVar7 != (xmlChar **)0x0) {
    do {
      text = *ppxVar7;
      if (text == (ParserChar *)0x0) {
        iVar5 = 3;
      }
      else {
        SVar3 = GeneratedSaxParser::Utils::calculateStringHash(text);
        buffer = ppxVar7[1];
        ppxVar7 = ppxVar7 + 2;
        if (SVar3 == 0x704ac8) {
          uVar4 = GeneratedSaxParser::Utils::toUint64(buffer,(bool *)((long)&uStack_38 + 6));
          *(uint64 *)(pbVar2 + 0x10) = uVar4;
          if ((uStack_38._6_1_ == '\x01') &&
             (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                 ERROR_ATTRIBUTE_PARSING_FAILED,0xe8b5255,0x704ac8,buffer), bVar1))
          {
LAB_006c3704:
            bVar1 = false;
            iVar5 = 1;
          }
          else {
            iVar5 = 4;
            bVar1 = true;
            if (uStack_38._6_1_ == '\0') {
              *pbVar2 = *pbVar2 | 1;
            }
          }
LAB_006c3743:
          if (!bVar1) goto LAB_006c374a;
        }
        else if (SVar3 == 0x76887d) {
          *(ParserChar **)(pbVar2 + 8) = buffer;
        }
        else {
          if (SVar3 == 0x7c83b5) {
            bVar1 = GeneratedSaxParser::Utils::toBool(buffer,(bool *)((long)&uStack_38 + 7));
            pbVar2[4] = bVar1;
            if ((uStack_38._7_1_ == '\x01') &&
               (bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                                  ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                   ERROR_ATTRIBUTE_PARSING_FAILED,0xe8b5255,0x7c83b5,buffer), bVar1)
               ) goto LAB_006c3704;
            iVar5 = 4;
            bVar1 = true;
            goto LAB_006c3743;
          }
          bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_UNKNOWN_ATTRIBUTE,0xe8b5255,text,buffer);
          iVar5 = 1;
          if (bVar1) goto LAB_006c374a;
        }
        iVar5 = 0;
      }
LAB_006c374a:
    } while (iVar5 == 0);
    if (iVar5 != 3) {
      bVar6 = false;
    }
  }
  return bVar6;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__texture1D_enable( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__texture1D_enable( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

texture1D_enable__AttributeData* attributeData = newData<texture1D_enable__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_value:
    {
bool failed;
attributeData->value = GeneratedSaxParser::Utils::toBool(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_TEXTURE1D_ENABLE,
        HASH_ATTRIBUTE_value,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_param:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_TEXTURE1D_ENABLE,
            HASH_ATTRIBUTE_param,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    case HASH_ATTRIBUTE_index:
    {
bool failed;
attributeData->index = GeneratedSaxParser::Utils::toUint64(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_TEXTURE1D_ENABLE,
        HASH_ATTRIBUTE_index,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= texture1D_enable__AttributeData::ATTRIBUTE_INDEX_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_TEXTURE1D_ENABLE, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}